

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

bool anon_unknown.dwarf_16bd::parseSkipLine(char **str)

{
  char *pcVar1;
  bool local_21;
  char *end;
  char **str_local;
  
  pcVar1 = String::findOneOf(*str,"\r\n");
  if (pcVar1 == (char *)0x0) {
    str_local._7_1_ = false;
  }
  else {
    *str = pcVar1;
    if (**str == '\r') {
      *str = *str + 1;
    }
    if (**str == '\n') {
      *str = *str + 1;
    }
    local_21 = false;
    if (**str != '\r') {
      local_21 = **str != '\n';
    }
    str_local._7_1_ = local_21;
  }
  return str_local._7_1_;
}

Assistant:

bool parseSkipLine(const char*& str)
    {
        const char* end = String::findOneOf(str, "\r\n");
        if (!end)
            return false;
        str = end;
        if (*str == '\r')
            ++str;
        if (*str == '\n')
            ++str;
        return *str != '\r' && *str != '\n';
    }